

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

void duckdb::ParseDirpathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  unsigned_long *puVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  reference vector;
  idx_t iVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  idx_t iVar17;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  ulong uVar18;
  idx_t iVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  anon_struct_16_3_d7536bce_for_pointer aVar24;
  string_t sVar25;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  Vector separator;
  UnifiedVectorFormat ldata;
  Vector trim_extension;
  idx_t in_stack_fffffffffffffe18;
  idx_t local_1d8;
  ulong local_1d0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  idx_t local_198;
  Vector local_190;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  sVar25.value.pointer.ptr = "ESaISt4pairIKSB_SD_EEEbSB_";
  sVar25.value._0_8_ = 0x6166656400000007;
  Value::Value((Value *)&local_98,sVar25);
  Vector::Vector(&local_190,(Value *)&local_98);
  Value::~Value((Value *)&local_98);
  Value::Value((Value *)&local_128,0);
  Vector::Vector(&local_98,(Value *)&local_128);
  Value::~Value((Value *)&local_128);
  ReadOptionalArgs(args,&local_190,&local_98,(bool *)&DAT_00000001);
  VVar1 = vector->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR &&
      (local_190.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
       ((local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((*local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))))
    {
      aVar24 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)*(anon_struct_16_3_d7536bce_for_pointer *)local_190.data,in_R9,
                          in_stack_fffffffffffffe18);
      paVar3->pointer = aVar24;
      goto LAB_01b0c53c;
    }
  }
  else {
    local_1d8 = args->count;
    if ((local_190.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar20 = vector->data;
      if ((local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((*local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))
      {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar4 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_1d8 != 0) {
            aVar24 = *(anon_struct_16_3_d7536bce_for_pointer *)local_190.data;
            lVar15 = 8;
            do {
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + lVar15);
              left_02.value._0_8_ = *(undefined8 *)(pdVar20 + lVar15 + -8);
              sVar25 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar24,in_R9,
                                  in_stack_fffffffffffffe18);
              *(long *)(pdVar4 + lVar15 + -8) = sVar25.value._0_8_;
              *(long *)(pdVar4 + lVar15) = sVar25.value._8_8_;
              lVar15 = lVar15 + 0x10;
              local_1d8 = local_1d8 - 1;
            } while (local_1d8 != 0);
          }
        }
        else if (0x3f < local_1d8 + 0x3f) {
          uVar13 = 0;
          uVar22 = 0;
          do {
            puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar23 = uVar22 + 0x40;
              if (local_1d8 <= uVar22 + 0x40) {
                uVar23 = local_1d8;
              }
LAB_01b0c47d:
              uVar16 = uVar22;
              if (uVar22 < uVar23) {
                aVar24 = *(anon_struct_16_3_d7536bce_for_pointer *)local_190.data;
                uVar14 = uVar22 << 4 | 8;
                do {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar14);
                  left_00.value._0_8_ = *(undefined8 *)(pdVar20 + (uVar14 - 8));
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,(string_t)aVar24,in_R9
                                      ,in_stack_fffffffffffffe18);
                  *(long *)(pdVar4 + (uVar14 - 8)) = sVar25.value._0_8_;
                  *(long *)(pdVar4 + uVar14) = sVar25.value._8_8_;
                  uVar22 = uVar22 + 1;
                  uVar14 = uVar14 + 0x10;
                  uVar16 = uVar23;
                } while (uVar23 != uVar22);
              }
            }
            else {
              uVar14 = puVar2[uVar13];
              uVar23 = uVar22 + 0x40;
              if (local_1d8 <= uVar22 + 0x40) {
                uVar23 = local_1d8;
              }
              uVar16 = uVar23;
              if (uVar14 != 0) {
                if (uVar14 == 0xffffffffffffffff) goto LAB_01b0c47d;
                uVar16 = uVar22;
                if (uVar22 < uVar23) {
                  uVar21 = uVar22 << 4 | 8;
                  uVar18 = 0;
                  do {
                    if ((uVar14 >> (uVar18 & 0x3f) & 1) != 0) {
                      left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar21);
                      left.value._0_8_ = *(undefined8 *)(pdVar20 + (uVar21 - 8));
                      sVar25 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left,
                                          (string_t)
                                          *(anon_struct_16_3_d7536bce_for_pointer *)local_190.data,
                                          in_R9,in_stack_fffffffffffffe18);
                      *(long *)(pdVar4 + (uVar21 - 8)) = sVar25.value._0_8_;
                      *(long *)(pdVar4 + uVar21) = sVar25.value._8_8_;
                    }
                    uVar18 = uVar18 + 1;
                    uVar21 = uVar21 + 0x10;
                    uVar16 = uVar23;
                  } while (uVar23 - uVar22 != uVar18);
                }
              }
            }
            uVar13 = uVar13 + 1;
            uVar22 = uVar16;
          } while (uVar13 != local_1d8 + 0x3f >> 6);
        }
        goto LAB_01b0c53c;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || local_190.vector_type != FLAT_VECTOR) {
        if (local_190.vector_type == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar20 = vector->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(&local_190);
          this = &result->validity;
          ValidityMask::Combine(this,&local_190.validity,local_1d8);
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (local_1d8 != 0) {
              lVar15 = 8;
              do {
                left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + lVar15);
                left_06.value._0_8_ = *(undefined8 *)(pdVar20 + lVar15 + -8);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)((long)local_190.data + lVar15);
                right_06.value._0_8_ = *(undefined8 *)((long)local_190.data + lVar15 + -8);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_06,right_06,in_R9,
                                    in_stack_fffffffffffffe18);
                *(long *)(pdVar4 + lVar15 + -8) = sVar25.value._0_8_;
                *(long *)(pdVar4 + lVar15) = sVar25.value._8_8_;
                lVar15 = lVar15 + 0x10;
                local_1d8 = local_1d8 - 1;
              } while (local_1d8 != 0);
            }
          }
          else if (0x3f < local_1d8 + 0x3f) {
            uVar22 = 0;
            local_1d0 = 0;
            do {
              puVar2 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                uVar13 = uVar22 + 0x40;
                if (local_1d8 <= uVar22 + 0x40) {
                  uVar13 = local_1d8;
                }
LAB_01b0ca3f:
                uVar14 = uVar22;
                if (uVar22 < uVar13) {
                  uVar23 = uVar22 << 4 | 8;
                  do {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar23);
                    left_04.value._0_8_ = *(undefined8 *)(pdVar20 + (uVar23 - 8));
                    right_03.value.pointer.ptr =
                         (char *)*(undefined8 *)((long)local_190.data + uVar23);
                    right_03.value._0_8_ = *(undefined8 *)((long)local_190.data + (uVar23 - 8));
                    sVar25 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                        in_stack_fffffffffffffe18);
                    *(long *)(pdVar4 + (uVar23 - 8)) = sVar25.value._0_8_;
                    *(long *)(pdVar4 + uVar23) = sVar25.value._8_8_;
                    uVar22 = uVar22 + 1;
                    uVar23 = uVar23 + 0x10;
                    uVar14 = uVar13;
                  } while (uVar13 != uVar22);
                }
              }
              else {
                uVar23 = puVar2[local_1d0];
                uVar13 = uVar22 + 0x40;
                if (local_1d8 <= uVar22 + 0x40) {
                  uVar13 = local_1d8;
                }
                uVar14 = uVar13;
                if (uVar23 != 0) {
                  if (uVar23 == 0xffffffffffffffff) goto LAB_01b0ca3f;
                  uVar14 = uVar22;
                  if (uVar22 < uVar13) {
                    uVar16 = uVar22 << 4 | 8;
                    uVar18 = 0;
                    do {
                      if ((uVar23 >> (uVar18 & 0x3f) & 1) != 0) {
                        left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + uVar16);
                        left_03.value._0_8_ = *(undefined8 *)(pdVar20 + (uVar16 - 8));
                        right_02.value.pointer.ptr =
                             (char *)*(undefined8 *)((long)local_190.data + uVar16);
                        right_02.value._0_8_ = *(undefined8 *)((long)local_190.data + (uVar16 - 8));
                        sVar25 = BinaryLambdaWrapper::
                                 Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                           ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,
                                            in_stack_fffffffffffffe18);
                        *(long *)(pdVar4 + (uVar16 - 8)) = sVar25.value._0_8_;
                        *(long *)(pdVar4 + uVar16) = sVar25.value._8_8_;
                      }
                      uVar18 = uVar18 + 1;
                      uVar16 = uVar16 + 0x10;
                      uVar14 = uVar13;
                    } while (uVar13 - uVar22 != uVar18);
                  }
                }
              }
              uVar22 = uVar14;
              local_1d0 = local_1d0 + 1;
            } while (local_1d0 != local_1d8 + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
          Vector::ToUnifiedFormat(vector,local_1d8,&local_128);
          Vector::ToUnifiedFormat(&local_190,local_1d8,&local_e0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar20 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_1d8 != 0) {
              psVar5 = (local_128.sel)->sel_vector;
              psVar6 = (local_e0.sel)->sel_vector;
              pdVar20 = pdVar20 + 8;
              iVar19 = 0;
              do {
                iVar10 = iVar19;
                if (psVar5 != (sel_t *)0x0) {
                  iVar10 = (idx_t)psVar5[iVar19];
                }
                iVar17 = iVar19;
                if (psVar6 != (sel_t *)0x0) {
                  iVar17 = (idx_t)psVar6[iVar19];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_128.data + iVar10 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_128.data + iVar10 * 0x10);
                right.value.pointer.ptr = (char *)*(undefined8 *)(local_e0.data + iVar17 * 0x10 + 8)
                ;
                right.value._0_8_ = *(undefined8 *)(local_e0.data + iVar17 * 0x10);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                    in_stack_fffffffffffffe18);
                *(long *)(pdVar20 + -8) = sVar25.value._0_8_;
                *(long *)pdVar20 = sVar25.value._8_8_;
                iVar19 = iVar19 + 1;
                pdVar20 = pdVar20 + 0x10;
              } while (local_1d8 != iVar19);
            }
          }
          else if (local_1d8 != 0) {
            psVar5 = (local_128.sel)->sel_vector;
            psVar6 = (local_e0.sel)->sel_vector;
            pdVar20 = pdVar20 + 8;
            uVar22 = 0;
            do {
              uVar13 = uVar22;
              if (psVar5 != (sel_t *)0x0) {
                uVar13 = (ulong)psVar5[uVar22];
              }
              uVar23 = uVar22;
              if (psVar6 != (sel_t *)0x0) {
                uVar23 = (ulong)psVar6[uVar22];
              }
              if (((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)) &&
                 ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_128.data + uVar13 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_128.data + uVar13 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
                right_04.value._0_8_ = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
                sVar25 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    in_stack_fffffffffffffe18);
                *(long *)(pdVar20 + -8) = sVar25.value._0_8_;
                *(long *)pdVar20 = sVar25.value._8_8_;
              }
              else {
                _Var12._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                  local_198 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_1a8,&local_198);
                  p_Var9 = p_Stack_1a0;
                  peVar8 = local_1a8;
                  local_1a8 = (element_type *)0x0;
                  p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this_00 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar8;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var9;
                  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
                     p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var12._M_head_impl =
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var12._M_head_impl;
                }
                bVar7 = (byte)uVar22 & 0x3f;
                _Var12._M_head_impl[uVar22 >> 6] =
                     _Var12._M_head_impl[uVar22 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              uVar22 = uVar22 + 1;
              pdVar20 = pdVar20 + 0x10;
            } while (local_1d8 != uVar22);
          }
          if (local_e0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_128.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        goto LAB_01b0c53c;
      }
      paVar3 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar20 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(&local_190);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             local_190.validity.super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_1d8 != 0) {
            aVar24 = paVar3->pointer;
            lVar15 = 8;
            do {
              right_05.value.pointer.ptr = (char *)*(undefined8 *)((long)local_190.data + lVar15);
              right_05.value._0_8_ = *(undefined8 *)((long)local_190.data + lVar15 + -8);
              sVar25 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)aVar24,right_05,in_R9,
                                  in_stack_fffffffffffffe18);
              *(long *)(pdVar20 + lVar15 + -8) = sVar25.value._0_8_;
              *(long *)(pdVar20 + lVar15) = sVar25.value._8_8_;
              lVar15 = lVar15 + 0x10;
              local_1d8 = local_1d8 - 1;
            } while (local_1d8 != 0);
          }
        }
        else if (0x3f < local_1d8 + 0x3f) {
          uVar13 = 0;
          uVar22 = 0;
          do {
            puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar23 = uVar22 + 0x40;
              if (local_1d8 <= uVar22 + 0x40) {
                uVar23 = local_1d8;
              }
LAB_01b0c80b:
              uVar16 = uVar22;
              if (uVar22 < uVar23) {
                aVar24 = paVar3->pointer;
                uVar14 = uVar22 << 4 | 8;
                do {
                  right_01.value.pointer.ptr =
                       (char *)*(undefined8 *)((long)local_190.data + uVar14);
                  right_01.value._0_8_ = *(undefined8 *)((long)local_190.data + (uVar14 - 8));
                  sVar25 = BinaryLambdaWrapper::
                           Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)aVar24,right_01,
                                      in_R9,in_stack_fffffffffffffe18);
                  *(long *)(pdVar20 + (uVar14 - 8)) = sVar25.value._0_8_;
                  *(long *)(pdVar20 + uVar14) = sVar25.value._8_8_;
                  uVar22 = uVar22 + 1;
                  uVar14 = uVar14 + 0x10;
                  uVar16 = uVar23;
                } while (uVar23 != uVar22);
              }
            }
            else {
              uVar14 = puVar2[uVar13];
              uVar23 = uVar22 + 0x40;
              if (local_1d8 <= uVar22 + 0x40) {
                uVar23 = local_1d8;
              }
              uVar16 = uVar23;
              if (uVar14 != 0) {
                if (uVar14 == 0xffffffffffffffff) goto LAB_01b0c80b;
                uVar16 = uVar22;
                if (uVar22 < uVar23) {
                  uVar21 = uVar22 << 4 | 8;
                  uVar18 = 0;
                  do {
                    if ((uVar14 >> (uVar18 & 0x3f) & 1) != 0) {
                      right_00.value.pointer.ptr =
                           (char *)*(undefined8 *)((long)local_190.data + uVar21);
                      right_00.value._0_8_ = *(undefined8 *)((long)local_190.data + (uVar21 - 8));
                      sVar25 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                          right_00,in_R9,in_stack_fffffffffffffe18);
                      *(long *)(pdVar20 + (uVar21 - 8)) = sVar25.value._0_8_;
                      *(long *)(pdVar20 + uVar21) = sVar25.value._8_8_;
                    }
                    uVar18 = uVar18 + 1;
                    uVar21 = uVar21 + 0x10;
                    uVar16 = uVar23;
                  } while (uVar23 - uVar22 != uVar18);
                }
              }
            }
            uVar13 = uVar13 + 1;
            uVar22 = uVar16;
          } while (uVar13 != local_1d8 + 0x3f >> 6);
        }
        goto LAB_01b0c53c;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01b0c53c:
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_190.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_190.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_190.type);
  return;
}

Assistant:

static void ParseDirpathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(false);
	ReadOptionalArgs(args, separator, trim_extension, true);

	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    path, separator, result, args.size(), [&](string_t input_path, string_t input_sep) {
		    auto path = input_path.GetData();
		    auto path_size = input_path.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    auto last_sep = FindLast(path, path_size, sep);
		    if (last_sep == 0 && path_size == 1) {
			    last_sep = 1;
		    }
		    idx_t new_size = (IsIdxValid(last_sep, path_size)) ? last_sep : 0;

		    auto target = StringVector::EmptyString(result, new_size);
		    auto output = target.GetDataWriteable();
		    memcpy(output, path, new_size);
		    target.Finalize();
		    return StringVector::AddString(result, target);
	    });
}